

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

QWizardPage * __thiscall
QMap<int,_QWizardPage_*>::value(QMap<int,_QWizardPage_*> *this,int *key,QWizardPage **defaultValue)

{
  QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>
  *pQVar1;
  const_iterator cVar2;
  
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 != (QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>
                 *)0x0) {
    cVar2 = std::
            _Rb_tree<int,_std::pair<const_int,_QWizardPage_*>,_std::_Select1st<std::pair<const_int,_QWizardPage_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>
            ::find(&(pQVar1->m)._M_t,key);
    if ((_Rb_tree_header *)cVar2._M_node !=
        &(((this->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header) {
      defaultValue = (QWizardPage **)&cVar2._M_node[1]._M_parent;
    }
  }
  return (QWizardPage *)(_Base_ptr)*defaultValue;
}

Assistant:

T value(const Key &key, const T &defaultValue = T()) const
    {
        if (!d)
            return defaultValue;
        const auto i = d->m.find(key);
        if (i != d->m.cend())
            return i->second;
        return defaultValue;
    }